

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
cnn::LookupParameters::Initialize
          (LookupParameters *this,uint index,vector<float,_std::allocator<float>_> *val)

{
  pointer pfVar1;
  pointer pfVar2;
  uint uVar3;
  
  pfVar1 = (val->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pfVar2 = (val->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar3 = Dim::size(&this->dim);
  if (uVar3 == (uint)((ulong)((long)pfVar1 - (long)pfVar2) >> 2)) {
    pfVar1 = (val->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    memcpy((this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start[index].v,pfVar1,
           (long)(val->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pfVar1);
    return;
  }
  __assert_fail("int(val.size()) == int(dim.size())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/model.cc"
                ,99,"void cnn::LookupParameters::Initialize(unsigned int, const vector<float> &)");
}

Assistant:

void LookupParameters::Initialize(unsigned index, const vector<float>& val) {
  assert(int(val.size()) == int(dim.size()));
#if HAVE_CUDA
  cerr << "implement LookupParameters::Initialize\n";
  throw cuda_not_implemented("LookupParameters::Initialize");
#else
  memcpy(values[index].v, &val[0], val.size() * sizeof(float));
#endif
}